

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O0

QCborMap QCborMap::fromVariantMap(QVariantMap *map)

{
  long lVar1;
  bool bVar2;
  QCborContainerPrivate *variant;
  QExplicitlySharedDataPointer<QCborContainerPrivate> in_RDI;
  long in_FS_OFFSET;
  QCborContainerPrivate *d;
  QCborMap *m;
  const_iterator end;
  const_iterator it;
  const_iterator *in_stack_ffffffffffffff58;
  QMap<QString,_QVariant> *in_stack_ffffffffffffff60;
  QCborContainerPrivate *in_stack_ffffffffffffff68;
  QCborContainerPrivate *in_stack_ffffffffffffff70;
  QCborContainerPrivate *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QCborMap((QCborMap *)0x48a380);
  QMap<QString,_QVariant>::size(in_stack_ffffffffffffff60);
  detach((QCborMap *)in_stack_ffffffffffffff70,(qsizetype)in_stack_ffffffffffffff68);
  variant = QExplicitlySharedDataPointer<QCborContainerPrivate>::data
                      ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x48a3af);
  QMap<QString,_QVariant>::begin((QMap<QString,_QVariant> *)in_stack_ffffffffffffff70);
  QMap<QString,_QVariant>::end((QMap<QString,_QVariant> *)in_stack_ffffffffffffff70);
  while (bVar2 = ::operator!=((const_iterator *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
        , bVar2) {
    QMap<QString,_QVariant>::const_iterator::key((const_iterator *)0x48a459);
    QCborContainerPrivate::append(in_stack_ffffffffffffff70,(QString *)in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff68 = variant;
    variant = in_stack_ffffffffffffff68;
    in_stack_ffffffffffffff70 =
         (QCborContainerPrivate *)
         QMap<QString,_QVariant>::const_iterator::value((const_iterator *)0x48a488);
    appendVariant(in_stack_ffffffffffffffc0,(QVariant *)variant);
    QMap<QString,_QVariant>::const_iterator::operator++((const_iterator *)in_stack_ffffffffffffff60)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)in_RDI.d.ptr;
}

Assistant:

QCborMap QCborMap::fromVariantMap(const QVariantMap &map)
{
    QCborMap m;
    m.detach(map.size());
    QCborContainerPrivate *d = m.d.data();

    auto it = map.begin();
    auto end = map.end();
    for ( ; it != end; ++it) {
        d->append(it.key());
        appendVariant(d, it.value());
    }
    return m;
}